

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-game.c
# Opt level: O1

void cmd_init(void)

{
  wchar_t wVar1;
  uint uVar2;
  cmd_info_conflict ***pppcVar3;
  long lVar4;
  cmd_info_conflict **ppcVar5;
  cmd_info_conflict *pcVar6;
  size_t sVar7;
  ulong uVar8;
  wchar_t wVar9;
  
  wVar9 = L'\0';
  memset(converted_list,0,0x1000);
  if (nested_lists != (cmd_info_conflict ***)0x0) {
    if (n_nested != L'\0') {
      uVar8 = 0;
      do {
        mem_free(nested_lists[uVar8]);
        uVar8 = uVar8 + 1;
      } while (uVar8 < (uint)n_nested);
    }
    nested_lists = (cmd_info_conflict ***)0x0;
  }
  lVar4 = 0;
  do {
    wVar1 = *(wchar_t *)((long)&cmds_all[0].keymap + lVar4);
    if (wVar1 < wVar9) {
      wVar1 = wVar9;
    }
    wVar9 = wVar1;
    lVar4 = lVar4 + 0x20;
  } while (lVar4 != 0x200);
  n_nested = wVar9;
  if ((L'\0' < wVar9) &&
     (nested_lists = (cmd_info_conflict ***)mem_zalloc((ulong)(uint)wVar9 << 3), n_nested != L'\0'))
  {
    uVar8 = 0;
    do {
      ppcVar5 = (cmd_info_conflict **)mem_zalloc(0x800);
      nested_lists[uVar8] = ppcVar5;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (uint)n_nested);
  }
  wVar9 = n_nested;
  pppcVar3 = nested_lists;
  lVar4 = 0;
  do {
    pcVar6 = cmds_all[lVar4].list;
    wVar1 = cmds_all[lVar4].keymap;
    if ((ulong)(uint)wVar1 == 0) {
      for (sVar7 = cmds_all[lVar4].len; sVar7 != 0; sVar7 = sVar7 - 1) {
        if (pcVar6->key[1] == 0) {
          pcVar6->key[1] = pcVar6->key[0];
        }
        if (((ulong)pcVar6->key[0] != 0) && (uVar2 = pcVar6->key[1], (ulong)uVar2 != 0)) {
          converted_list[0][pcVar6->key[0]] = pcVar6;
          converted_list[1][uVar2] = pcVar6;
        }
        pcVar6 = pcVar6 + 1;
      }
    }
    else if (L'\0' < wVar1) {
      if (wVar9 < wVar1) {
        __assert_fail("kidx < n_nested",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-game.c"
                      ,0x1a4,"void cmd_init(void)");
      }
      for (sVar7 = cmds_all[lVar4].len; sVar7 != 0; sVar7 = sVar7 - 1) {
        uVar2 = pcVar6->key[0];
        pcVar6->key[1] = uVar2;
        if (pppcVar3[(ulong)(uint)wVar1 - 1][uVar2] != (cmd_info_conflict *)0x0) {
          __assert_fail("!nested_lists[kidx][commands[i].key[0]]",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-game.c"
                        ,0x1b0,"void cmd_init(void)");
        }
        pppcVar3[(ulong)(uint)wVar1 - 1][uVar2] = pcVar6;
        pcVar6 = pcVar6 + 1;
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  return;
}

Assistant:

void cmd_init(void)
{
	size_t i, j;

	memset(converted_list, 0, sizeof(converted_list));

	/* Set up storage for the nested command lists */
	if (nested_lists != NULL) {
		assert(n_nested >= 0);
		for (j = 0; j < (size_t)n_nested; j++) {
			mem_free(nested_lists[j]);
		}
		nested_lists = NULL;
	}
	n_nested = 0;
	for (j = 0; j < N_ELEMENTS(cmds_all) - 1; j++) {
		n_nested = MAX(n_nested, cmds_all[j].keymap);
	}
	if (n_nested > 0) {
		nested_lists = mem_zalloc(n_nested * sizeof(*nested_lists));
		for (j = 0; j < (size_t)n_nested; j++) {
			nested_lists[j] = mem_zalloc((UCHAR_MAX + 1) *
				sizeof(*(nested_lists[j])));
		}
	}

	/* Go through all generic commands (-1 for NULL end entry) */
	for (j = 0; j < N_ELEMENTS(cmds_all) - 1; j++)
	{
		struct cmd_info *commands = cmds_all[j].list;

		/* Fill everything in */
		if (cmds_all[j].keymap == 0) {
			for (i = 0; i < cmds_all[j].len; i++) {
				/* If a roguelike key isn't set, use default */
				if (!commands[i].key[1])
					commands[i].key[1] = commands[i].key[0];

				/* Skip entries that don't have a valid key. */
				if (!commands[i].key[0] || !commands[i].key[1])
					continue;

				converted_list[0][commands[i].key[0]] =
					&commands[i];
				converted_list[1][commands[i].key[1]] =
					&commands[i];
			}
		} else if (cmds_all[j].keymap > 0) {
			int kidx = cmds_all[j].keymap - 1;

			assert(kidx < n_nested);
			for (i = 0; i < cmds_all[j].len; i++) {
				/*
				 * Nested commands don't go through a keymap;
				 * use the default for the roguelike key.
				 */
				commands[i].key[1] = commands[i].key[0];

				/*
				 * Check for duplicated keys in the same
				 * command set.
				 */
				assert(!nested_lists[kidx][commands[i].key[0]]);

				nested_lists[kidx][commands[i].key[0]] =
					&commands[i];
			}
		}
	}
}